

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecjpake.c
# Opt level: O1

int mbedtls_ecjpake_set_point_format(mbedtls_ecjpake_context *ctx,int point_format)

{
  int iVar1;
  
  iVar1 = -0x4f80;
  if ((uint)point_format < 2) {
    ctx->point_format = point_format;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int mbedtls_ecjpake_set_point_format(mbedtls_ecjpake_context *ctx,
                                     int point_format)
{
    switch (point_format) {
        case MBEDTLS_ECP_PF_UNCOMPRESSED:
        case MBEDTLS_ECP_PF_COMPRESSED:
            ctx->point_format = point_format;
            return 0;
        default:
            return MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
    }
}